

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

bool CheckWarmup(HTTPRequest *req)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  string statusmessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar3;
  char *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  HTTPStatusCode in_stack_ffffffffffffffcc;
  HTTPRequest *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  bVar2 = RPCIsInWarmup((string *)
                        CONCAT17(in_stack_ffffffffffffff7f,
                                 CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)));
  if (bVar2) {
    std::operator+(in_stack_ffffffffffffffb8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    bVar3 = RESTERR(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
    std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  }
  else {
    bVar3 = 1;
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool CheckWarmup(HTTPRequest* req)
{
    std::string statusmessage;
    if (RPCIsInWarmup(&statusmessage))
         return RESTERR(req, HTTP_SERVICE_UNAVAILABLE, "Service temporarily unavailable: " + statusmessage);
    return true;
}